

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

FillerParameter *
google::protobuf::internal::GenericTypeHandler<caffe::FillerParameter>::New(Arena *arena)

{
  Arena *arena_local;
  FillerParameter *local_28;
  FillerParameter *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (FillerParameter *)operator_new(0x40);
    caffe::FillerParameter::FillerParameter(local_28);
  }
  else {
    local_28 = (FillerParameter *)
               Arena::AllocateAligned(arena,(type_info *)&caffe::FillerParameter::typeinfo,0x40);
    caffe::FillerParameter::FillerParameter(local_28);
    Arena::AddListNode(arena,local_28,arena_destruct_object<caffe::FillerParameter>);
  }
  return local_28;
}

Assistant:

static inline GenericType* New(Arena* arena) {
    return ::google::protobuf::Arena::CreateMaybeMessage<Type>(
        arena, static_cast<GenericType*>(0));
  }